

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

ListReader * __thiscall
capnp::_::PointerReader::getListAnySize
          (ListReader *__return_storage_ptr__,PointerReader *this,word *defaultValue)

{
  WirePointer *pWVar1;
  WirePointer *pWVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  StructDataBitCount SVar6;
  word *pwVar7;
  CapTableReader *pCVar8;
  Arena *pAVar9;
  ulong uVar10;
  ReadLimiter *pRVar11;
  int iVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SegmentReader *pSVar13;
  ulong uVar14;
  WirePointer *pWVar15;
  uint uVar16;
  SegmentReader *pSVar17;
  ulong uVar18;
  ElementSize EVar19;
  uint uVar20;
  long lVar21;
  char *pcVar22;
  ulong uVar23;
  uint uVar24;
  WirePointer *pWVar25;
  Fault f;
  
  pWVar25 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar25 = this->pointer;
  }
  pSVar13 = this->segment;
  pWVar1 = pWVar25 + 1;
  uVar16 = (uint)*(uint64_t *)&(pWVar25->offsetAndKind).value;
  lVar21 = (long)((int)uVar16 >> 2);
  pWVar15 = pWVar1 + lVar21;
  if (((pSVar13 != (SegmentReader *)0x0) &&
      (pwVar7 = (pSVar13->ptr).ptr, pWVar2 = (WirePointer *)(pwVar7 + (pSVar13->ptr).size_),
      pWVar15 = pWVar2, (long)pwVar7 - (long)pWVar1 >> 3 <= lVar21)) &&
     (pWVar15 = pWVar1 + lVar21, (long)pWVar2 - (long)pWVar1 >> 3 < lVar21)) {
    pWVar15 = pWVar2;
  }
  pCVar8 = this->capTable;
  iVar5 = this->nestingLimit;
  if ((pWVar25->field_1).upper32Bits == 0 && uVar16 == 0) goto LAB_0015d116;
  if (iVar5 < 1) goto LAB_0015d318;
  if (pSVar13 == (SegmentReader *)0x0) {
    pSVar13 = (SegmentReader *)0x0;
LAB_0015d017:
    if (pWVar15 == (WirePointer *)0x0) goto LAB_0015d116;
  }
  else {
    if ((uVar16 & 3) != 2) goto LAB_0015d017;
    iVar12 = (*pSVar13->arena->_vptr_Arena[2])();
    pSVar13 = (SegmentReader *)CONCAT44(extraout_var,iVar12);
    if (pSVar13 == (SegmentReader *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x234,FAILED,"segment != nullptr",
                 "\"Message contains far pointer to unknown segment.\"",
                 (char (*) [49])"Message contains far pointer to unknown segment.");
      goto LAB_0015d4df;
    }
    uVar18 = (pSVar13->ptr).size_;
    uVar16 = (uint)*(uint64_t *)&(pWVar25->offsetAndKind).value;
    uVar14 = (ulong)(uVar16 >> 3);
    if ((long)uVar18 < (long)(ulong)(uVar16 >> 3)) {
      uVar14 = uVar18;
    }
    uVar23 = 2 - (ulong)((uVar16 & 4) == 0);
    if (uVar18 < uVar14 + uVar23) {
LAB_0015d06b:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x23c,FAILED,"boundsCheck(segment, ptr, padWords)",
                 "\"Message contains out-of-bounds far pointer.\"",
                 (char (*) [44])"Message contains out-of-bounds far pointer.");
      goto LAB_0015d4df;
    }
    pwVar7 = (pSVar13->ptr).ptr;
    pAVar9 = pSVar13->arena;
    uVar10 = pSVar13->readLimiter->limit;
    if (uVar10 < uVar23) {
      (*pAVar9->_vptr_Arena[3])();
      goto LAB_0015d06b;
    }
    pWVar25 = (WirePointer *)(pwVar7 + uVar14);
    pWVar1 = pWVar25 + 1;
    pSVar13->readLimiter->limit = uVar10 - uVar23;
    if ((uVar16 & 4) != 0) {
      iVar12 = (*pAVar9->_vptr_Arena[2])(pAVar9,(ulong)(pWVar25->field_1).upper32Bits);
      pSVar13 = (SegmentReader *)CONCAT44(extraout_var_00,iVar12);
      if (pSVar13 == (SegmentReader *)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x24e,FAILED,"newSegment != nullptr",
                   "\"Message contains double-far pointer to unknown segment.\"",
                   (char (*) [56])"Message contains double-far pointer to unknown segment.");
        goto LAB_0015d4df;
      }
      uVar16 = (uint)*(uint64_t *)&(pWVar25->offsetAndKind).value;
      if ((uVar16 & 3) != 2) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x252,FAILED,"pad->kind() == WirePointer::FAR",
                   "\"Second word of double-far pad must be far pointer.\"",
                   (char (*) [51])"Second word of double-far pad must be far pointer.");
        goto LAB_0015d4df;
      }
      uVar14 = (ulong)(uVar16 >> 3);
      uVar18 = (pSVar13->ptr).size_;
      if ((long)uVar18 < (long)uVar14) {
        uVar14 = uVar18;
      }
      pWVar15 = (WirePointer *)((pSVar13->ptr).ptr + uVar14);
      pWVar25 = pWVar1;
      goto LAB_0015d017;
    }
    uVar16 = (uint)*(uint64_t *)&(pWVar25->offsetAndKind).value;
    lVar21 = (long)((int)uVar16 >> 2);
    pWVar15 = (WirePointer *)(pwVar7 + uVar18);
    if (((long)pwVar7 - (long)pWVar1 >> 3 <= lVar21) &&
       (lVar21 <= (long)pWVar15 - (long)pWVar1 >> 3)) {
      pWVar15 = pWVar1 + lVar21;
      goto LAB_0015d154;
    }
  }
  uVar16 = (uint)*(uint64_t *)&(pWVar25->offsetAndKind).value;
LAB_0015d154:
  do {
    if ((uVar16 & 3) != 1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[67]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8cf,FAILED,"ref->kind() == WirePointer::LIST",
                 "\"Message contains non-list pointer where list pointer was expected.\"",
                 (char (*) [67])"Message contains non-list pointer where list pointer was expected."
                );
      goto LAB_0015d4df;
    }
    uVar16 = (pWVar25->field_1).upper32Bits;
    EVar19 = (ElementSize)uVar16 & INLINE_COMPOSITE;
    if (EVar19 == INLINE_COMPOSITE) {
      uVar16 = uVar16 >> 3;
      if (pSVar13 != (SegmentReader *)0x0) {
        if (((long)pWVar15 - (long)(pSVar13->ptr).ptr >> 3) + (ulong)uVar16 + 1 <=
            (pSVar13->ptr).size_) {
          uVar18 = (ulong)uVar16 + 1;
          uVar14 = pSVar13->readLimiter->limit;
          if (uVar18 <= uVar14) {
            pSVar13->readLimiter->limit = uVar14 - uVar18;
            goto LAB_0015d1b1;
          }
          (*pSVar13->arena->_vptr_Arena[3])();
        }
        pcVar22 = "boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)";
        iVar12 = 0x8db;
        goto LAB_0015d4d8;
      }
LAB_0015d1b1:
      uVar20 = (uint)*(uint64_t *)&(pWVar15->offsetAndKind).value;
      if ((uVar20 & 3) == 0) {
        uVar20 = uVar20 >> 2 & 0x1fffffff;
        uVar18 = (ulong)uVar20;
        uVar3 = *(ushort *)&pWVar15->field_1;
        uVar4 = (pWVar15->field_1).structRef.ptrCount.value;
        uVar24 = (uint)uVar4 + (uint)uVar3;
        if (uVar24 * uVar18 < (ulong)uVar16 || uVar24 * uVar18 - (ulong)uVar16 == 0) {
          pSVar17 = (SegmentReader *)0x0;
          if (uVar24 != 0) {
            pSVar17 = pSVar13;
          }
          if ((pSVar13 != (SegmentReader *)0x0) && (uVar24 == 0)) {
            uVar14 = pSVar13->readLimiter->limit;
            if (uVar14 < uVar18) {
              (*pSVar13->arena->_vptr_Arena[3])();
              pcVar22 = "amplifiedRead(segment, size * (ONE * WORDS / ELEMENTS))";
              iVar12 = 0x8f2;
LAB_0015d49c:
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41]>
                        (&f,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                         ,iVar12,FAILED,pcVar22,"\"Message contains amplified list pointer.\"",
                         (char (*) [41])"Message contains amplified list pointer.");
              goto LAB_0015d4df;
            }
            pSVar13->readLimiter->limit = uVar14 - uVar18;
            pSVar17 = pSVar13;
          }
          __return_storage_ptr__->segment = pSVar17;
          __return_storage_ptr__->capTable = pCVar8;
          __return_storage_ptr__->ptr = (byte *)(pWVar15 + 1);
          __return_storage_ptr__->elementCount = uVar20;
          __return_storage_ptr__->step = uVar24 * 0x40;
          __return_storage_ptr__->structDataSize = (uint)uVar3 << 6;
          __return_storage_ptr__->structPointerCount = uVar4;
          __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
code_r0x0015d21e:
          __return_storage_ptr__->nestingLimit = iVar5 + -1;
          return __return_storage_ptr__;
        }
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[57]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x8ea,FAILED,"upgradeBound<uint64_t>(size) * wordsPerElement <= wordCount",
                   "\"INLINE_COMPOSITE list\'s elements overrun its word count.\"",
                   (char (*) [57])"INLINE_COMPOSITE list\'s elements overrun its word count.");
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[61]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x8e2,FAILED,"tag->kind() == WirePointer::STRUCT",
                   "\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\"",
                   (char (*) [61])"INLINE_COMPOSITE lists of non-STRUCT type are not supported.");
      }
    }
    else {
      SVar6 = *(StructDataBitCount *)(BITS_PER_ELEMENT_TABLE + ((ulong)uVar16 & 7) * 4);
      uVar18 = (ulong)(uVar16 >> 3);
      uVar20 = (uint)(EVar19 == POINTER) * 0x40 + SVar6;
      if (pSVar13 == (SegmentReader *)0x0) goto LAB_0015d2c1;
      uVar14 = uVar20 * uVar18 + 0x3f >> 6 & 0xffffffff;
      if (((long)pWVar15 - (long)(pSVar13->ptr).ptr >> 3) + uVar14 <= (pSVar13->ptr).size_) {
        pAVar9 = pSVar13->arena;
        pRVar11 = pSVar13->readLimiter;
        if (uVar14 <= pRVar11->limit) {
          pRVar11->limit = pRVar11->limit - uVar14;
          if ((uVar16 & 7) == 0) {
            if (pRVar11->limit < uVar18) {
              (*pAVar9->_vptr_Arena[3])();
              pcVar22 = "amplifiedRead(segment, elementCount * (ONE * WORDS / ELEMENTS))";
              iVar12 = 0x93c;
              goto LAB_0015d49c;
            }
            pRVar11->limit = pRVar11->limit - uVar18;
          }
LAB_0015d2c1:
          __return_storage_ptr__->segment = pSVar13;
          __return_storage_ptr__->capTable = pCVar8;
          __return_storage_ptr__->ptr = (byte *)pWVar15;
          __return_storage_ptr__->elementCount = uVar16 >> 3;
          __return_storage_ptr__->step = uVar20;
          __return_storage_ptr__->structDataSize = SVar6;
          __return_storage_ptr__->structPointerCount = (ushort)(EVar19 == POINTER);
          __return_storage_ptr__->elementSize = EVar19;
          goto code_r0x0015d21e;
        }
        (*pAVar9->_vptr_Arena[3])();
      }
      pcVar22 = "boundsCheck(segment, ptr, wordCount)";
      iVar12 = 0x934;
LAB_0015d4d8:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,iVar12,FAILED,pcVar22,"\"Message contains out-of-bounds list pointer.\"",
                 (char (*) [45])"Message contains out-of-bounds list pointer.");
    }
LAB_0015d4df:
    while( true ) {
      kj::_::Debug::Fault::~Fault(&f);
LAB_0015d116:
      pWVar25 = (WirePointer *)defaultValue;
      if ((pWVar25 == (WirePointer *)0x0) ||
         (uVar16 = (uint)*(uint64_t *)&(pWVar25->offsetAndKind).value,
         (pWVar25->field_1).upper32Bits == 0 && uVar16 == 0)) {
        __return_storage_ptr__->ptr = (byte *)0x0;
        __return_storage_ptr__->elementCount = 0;
        __return_storage_ptr__->step = 0;
        __return_storage_ptr__->segment = (SegmentReader *)0x0;
        __return_storage_ptr__->capTable = (CapTableReader *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->step + 3) = 0;
        __return_storage_ptr__->nestingLimit = 0x7fffffff;
        return __return_storage_ptr__;
      }
      pWVar15 = pWVar25 + (long)((int)uVar16 >> 2) + 1;
      defaultValue = (word *)0x0;
      pSVar13 = (SegmentReader *)0x0;
      if (0 < iVar5) break;
LAB_0015d318:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[76]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8c3,FAILED,"nestingLimit > 0",
                 "\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\"",
                 (char (*) [76])
                 "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
    }
  } while( true );
}

Assistant:

ListReader PointerReader::getListAnySize(const word* defaultValue) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readListPointer(
      segment, capTable, ref, defaultValue, ElementSize::VOID /* dummy */, nestingLimit, false);
}